

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O1

void __thiscall COLLADASaxFWL::FormulasLoader::~FormulasLoader(FormulasLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_HelperLoaderBase)._vptr_HelperLoaderBase =
       (_func_int **)&PTR__FormulasLoader_009338a0;
  pcVar2 = (this->mCurrentFormulaNewParamSid)._M_dataplus._M_p;
  paVar1 = &(this->mCurrentFormulaNewParamSid).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  COLLADAFW::UniqueId::~UniqueId(&this->mCurrentCSymbolFunctionUniqueId);
  pcVar2 = (this->mCurrentTextDataAfterSep)._M_dataplus._M_p;
  paVar1 = &(this->mCurrentTextDataAfterSep).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->mCurrentTextData)._M_dataplus._M_p;
  paVar1 = &(this->mCurrentTextData).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::_Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_>::~_Deque_base
            ((_Deque_base<COLLADASaxFWL::Operator,_std::allocator<COLLADASaxFWL::Operator>_> *)
             &this->mOperatorStack);
  std::
  deque<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>,_std::allocator<std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>_>_>
  ::~deque(&(this->mNodeListStack).c);
  return;
}

Assistant:

FormulasLoader::~FormulasLoader()
	{
	}